

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential.c
# Opt level: O0

IceTImage icetSequentialCompose(void)

{
  int dest;
  IceTSizeType width;
  IceTSizeType height;
  IceTBoolean IVar1;
  IceTSizeType value;
  IceTInt *pIVar2;
  IceTInt *pIVar3;
  IceTInt *params;
  IceTSizeType piece_size;
  IceTImage local_88;
  IceTImage tile_image;
  IceTSizeType tile_height;
  IceTSizeType tile_width;
  IceTSizeType piece_offset;
  IceTSparseImage composited_image;
  IceTSparseImage rendered_image;
  int image_dest;
  int d_node;
  int local_44;
  int i;
  IceTInt *compose_group;
  IceTBoolean image_collect;
  IceTBoolean ordered_composite;
  IceTInt *tile_viewports;
  IceTInt *display_nodes;
  int local_18;
  IceTInt num_proc;
  IceTInt rank;
  IceTInt num_tiles;
  IceTImage my_image;
  
  icetGetIntegerv(0x10,&num_proc);
  icetGetIntegerv(2,&local_18);
  icetGetIntegerv(3,(IceTInt *)((long)&display_nodes + 4));
  pIVar2 = icetUnsafeStateGetInteger(0x1a);
  pIVar3 = icetUnsafeStateGetInteger(0x11);
  IVar1 = icetIsEnabled(0x142);
  compose_group._6_1_ = icetIsEnabled(0x146);
  if ((compose_group._6_1_ == '\0') && (1 < num_proc)) {
    icetRaiseDiagnostic("Sequential strategy must collect images with more than one tile.",
                        0xfffffffb,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/sequential.c"
                        ,0x2e);
    compose_group._6_1_ = '\x01';
  }
  params = (IceTInt *)icetGetStateBuffer(0x1a3,display_nodes._4_4_ << 2);
  _rank = icetImageNull();
  if (IVar1 == '\0') {
    for (local_44 = 0; local_44 < display_nodes._4_4_; local_44 = local_44 + 1) {
      params[local_44] = local_44;
    }
  }
  else {
    icetGetIntegerv(0x29,params);
  }
  for (local_44 = 0; local_44 < num_proc; local_44 = local_44 + 1) {
    dest = pIVar2[local_44];
    width = pIVar3[local_44 * 4 + 2];
    height = pIVar3[local_44 * 4 + 3];
    rendered_image.opaque_internals._0_4_ = dest;
    if (IVar1 != '\0') {
      for (rendered_image.opaque_internals._0_4_ = 0;
          params[(int)rendered_image.opaque_internals] != dest;
          rendered_image.opaque_internals._0_4_ = (int)rendered_image.opaque_internals + 1) {
      }
    }
    composited_image = icetGetStateBufferSparseImage(0x1a0,width,height);
    icetGetCompressedTileImage(local_44,composited_image);
    icetSingleImageCompose
              (params,display_nodes._4_4_,(int)rendered_image.opaque_internals,composited_image,
               (IceTSparseImage *)&tile_width,&tile_height);
    if (compose_group._6_1_ == '\0') {
      value = icetSparseImageGetNumPixels(_tile_width);
      if (value < 1) {
        _rank = icetImageNull();
        icetStateSetInteger(0x8c,-1);
        icetStateSetInteger(0x8d,0);
        icetStateSetInteger(0x8e,0);
      }
      else {
        _rank = icetGetStateBufferImage(0x1a1,width,height);
        icetDecompressSubImage(_tile_width,tile_height,_rank);
        icetStateSetInteger(0x8c,local_44);
        icetStateSetInteger(0x8d,tile_height);
        icetStateSetInteger(0x8e,value);
      }
    }
    else {
      if (dest == local_18) {
        local_88 = icetGetStateBufferImage(0x1a1,width,height);
      }
      else {
        local_88 = icetGetStateBufferImage(0x1a2,width,height);
      }
      icetSingleImageCollect(_tile_width,dest,tile_height,local_88);
      if (dest == local_18) {
        _rank = local_88.opaque_internals;
      }
    }
  }
  return (IceTImage)_rank;
}

Assistant:

IceTImage icetSequentialCompose(void)
{
    IceTInt num_tiles;
    IceTInt rank;
    IceTInt num_proc;
    const IceTInt *display_nodes;
    const IceTInt *tile_viewports;
    IceTBoolean ordered_composite;
    IceTBoolean image_collect;
    IceTImage my_image;
    IceTInt *compose_group;
    int i;

    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    icetGetIntegerv(ICET_RANK, &rank);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);
    display_nodes = icetUnsafeStateGetInteger(ICET_DISPLAY_NODES);
    tile_viewports = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
    ordered_composite = icetIsEnabled(ICET_ORDERED_COMPOSITE);
    image_collect = icetIsEnabled(ICET_COLLECT_IMAGES);

    if (!image_collect && (num_tiles > 1)) {
        icetRaiseWarning("Sequential strategy must collect images with more"
                         " than one tile.",
                         ICET_INVALID_OPERATION);
        image_collect = ICET_TRUE;
    }

    compose_group = icetGetStateBuffer(SEQUENTIAL_COMPOSE_GROUP_BUFFER,
                                       sizeof(IceTInt)*num_proc);

    my_image = icetImageNull();

    if (ordered_composite) {
	icetGetIntegerv(ICET_COMPOSITE_ORDER, compose_group);
    } else {
	for (i = 0; i < num_proc; i++) {
	    compose_group[i] = i;
	}
    }

  /* Render and compose every tile. */
    for (i = 0; i < num_tiles; i++) {
	int d_node = display_nodes[i];
	int image_dest;
        IceTSparseImage rendered_image;
        IceTSparseImage composited_image;
        IceTSizeType piece_offset;
        IceTSizeType tile_width;
        IceTSizeType tile_height;

        tile_width = tile_viewports[4*i + 2];
        tile_height = tile_viewports[4*i + 3];

      /* Make the image go to the display node. */
	if (ordered_composite) {
	    for (image_dest = 0; compose_group[image_dest] != d_node;
		 image_dest++);
	} else {
	  /* Technically, the above computation will work, but this is
	     faster. */
	    image_dest = d_node;
	}


        rendered_image = icetGetStateBufferSparseImage(SEQUENTIAL_IMAGE_BUFFER,
                                                       tile_width, tile_height);

        icetGetCompressedTileImage(i, rendered_image);
	icetSingleImageCompose(compose_group,
                               num_proc,
                               image_dest,
                               rendered_image,
                               &composited_image,
                               &piece_offset);

        if (image_collect) {
            IceTImage tile_image;

            /* If this processor is display node, make sure image goes to
               myColorBuffer. */
            if (d_node == rank) {
                tile_image = icetGetStateBufferImage(
                                                  SEQUENTIAL_FINAL_IMAGE_BUFFER,
                                                  tile_width, tile_height);
            } else {
                tile_image = icetGetStateBufferImage(
                                           SEQUENTIAL_INTERMEDIATE_IMAGE_BUFFER,
                                           tile_width, tile_height);
            }

            icetSingleImageCollect(composited_image,
                                   d_node,
                                   piece_offset,
                                   tile_image);

            if (d_node == rank) {
                my_image = tile_image;
            }
        } else { /* !image_collect */
            IceTSizeType piece_size
                = icetSparseImageGetNumPixels(composited_image);
            if (piece_size > 0) {
                my_image = icetGetStateBufferImage(
                                                  SEQUENTIAL_FINAL_IMAGE_BUFFER,
                                                  tile_width, tile_height);
                icetDecompressSubImage(composited_image,
                                       piece_offset,
                                       my_image);
                icetStateSetInteger(ICET_VALID_PIXELS_TILE, i);
                icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, piece_offset);
                icetStateSetInteger(ICET_VALID_PIXELS_NUM, piece_size);
            } else {
                my_image = icetImageNull();
                icetStateSetInteger(ICET_VALID_PIXELS_TILE, -1);
                icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, 0);
                icetStateSetInteger(ICET_VALID_PIXELS_NUM, 0);
            }
        }
    }

    return my_image;
}